

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7_arr_func_3.cpp
# Opt level: O2

void show_array(double *ar,int n)

{
  if (n < 1) {
    n = 0;
  }
  if (n != 0) {
    std::operator<<((ostream *)&std::cout,"Property #");
  }
  return;
}

Assistant:

void show_array (const double ar[], int n)
{
    using namespace std;
    for (int i = 0; i < n; i++)
    {
        cout << "Property #" << (i + 1) << " : $";
        cout << ar[i] << endl;
    }
}